

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

int Cudd_EquivDC(DdManager *dd,DdNode *F,DdNode *G,DdNode *D)

{
  uint uVar1;
  DdNode *g;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  uint uVar6;
  DdNode *G_00;
  DdNode *D_00;
  DdNode *F_00;
  uint uVar7;
  uint uVar8;
  DdNode *F_01;
  DdNode *f;
  DdNode *data;
  DdNode *local_48;
  
  data = dd->one;
  uVar3 = 1;
  if (F != G && data != D) {
    uVar3 = 0;
    if ((((DdNode *)((ulong)data ^ 1) != D) && ((DdNode *)((ulong)G ^ 1) != F)) && (dd->zero != D))
    {
      pDVar4 = F;
      if (G < F) {
        pDVar4 = G;
        G = F;
      }
      f = (DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe);
      g = (DdNode *)((ulong)G ^ 1);
      if (((ulong)pDVar4 & 1) == 0) {
        f = pDVar4;
        g = G;
      }
      pDVar4 = cuddCacheLookup(dd,0x4a,f,g,D);
      if (pDVar4 == (DdNode *)0x0) {
        uVar6 = 0x7fffffff;
        uVar3 = 0x7fffffff;
        if ((ulong)f->index != 0x7fffffff) {
          uVar3 = dd->perm[f->index];
        }
        pDVar4 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
        if ((ulong)pDVar4->index != 0x7fffffff) {
          uVar6 = dd->perm[pDVar4->index];
        }
        uVar7 = uVar3;
        if (uVar6 < uVar3) {
          uVar7 = uVar6;
        }
        pDVar5 = (DdNode *)((ulong)D & 0xfffffffffffffffe);
        uVar1 = dd->perm[pDVar5->index];
        uVar8 = uVar7;
        if (uVar1 < uVar7) {
          uVar8 = uVar1;
        }
        F_00 = f;
        F_01 = f;
        if (uVar8 == uVar3) {
          F_00 = (f->type).kids.T;
          F_01 = (f->type).kids.E;
        }
        G_00 = g;
        local_48 = g;
        if (uVar8 == uVar6) {
          G_00 = (pDVar4->type).kids.T;
          local_48 = (pDVar4->type).kids.E;
          if (g != pDVar4) {
            G_00 = (DdNode *)((ulong)G_00 ^ 1);
            local_48 = (DdNode *)((ulong)local_48 ^ 1);
          }
        }
        pDVar4 = D;
        D_00 = D;
        if (uVar1 <= uVar7) {
          pDVar4 = (pDVar5->type).kids.T;
          D_00 = (pDVar5->type).kids.E;
          if (pDVar5 != D) {
            pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
            D_00 = (DdNode *)((ulong)D_00 ^ 1);
          }
        }
        iVar2 = Cudd_EquivDC(dd,F_00,G_00,pDVar4);
        if (iVar2 == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = Cudd_EquivDC(dd,F_01,local_48,D_00);
        }
        if (uVar3 == 0) {
          data = (DdNode *)((ulong)data ^ 1);
        }
        cuddCacheInsert(dd,0x4a,f,g,D,data);
      }
      else {
        uVar3 = (uint)(pDVar4 == data);
      }
    }
  }
  return uVar3;
}

Assistant:

int
Cudd_EquivDC(
  DdManager * dd,
  DdNode * F,
  DdNode * G,
  DdNode * D)
{
    DdNode *tmp, *One, *Gr, *Dr;
    DdNode *Fv, *Fvn, *Gv, *Gvn, *Dv, *Dvn;
    int res;
    unsigned int flevel, glevel, dlevel, top;

    One = DD_ONE(dd);

    statLine(dd);
    /* Check terminal cases. */
    if (D == One || F == G) return(1);
    if (D == Cudd_Not(One) || D == DD_ZERO(dd) || F == Cudd_Not(G)) return(0);

    /* From now on, D is non-constant. */

    /* Normalize call to increase cache efficiency. */
    if (F > G) {
        tmp = F;
        F = G;
        G = tmp;
    }
    if (Cudd_IsComplement(F)) {
        F = Cudd_Not(F);
        G = Cudd_Not(G);
    }

    /* From now on, F is regular. */

    /* Check cache. */
    tmp = cuddCacheLookup(dd,DD_EQUIV_DC_TAG,F,G,D);
    if (tmp != NULL) return(tmp == One);

    /* Find splitting variable. */
    flevel = cuddI(dd,F->index);
    Gr = Cudd_Regular(G);
    glevel = cuddI(dd,Gr->index);
    top = ddMin(flevel,glevel);
    Dr = Cudd_Regular(D);
    dlevel = dd->perm[Dr->index];
    top = ddMin(top,dlevel);

    /* Compute cofactors. */
    if (top == flevel) {
        Fv = cuddT(F);
        Fvn = cuddE(F);
    } else {
        Fv = Fvn = F;
    }
    if (top == glevel) {
        Gv = cuddT(Gr);
        Gvn = cuddE(Gr);
        if (G != Gr) {
            Gv = Cudd_Not(Gv);
            Gvn = Cudd_Not(Gvn);
        }
    } else {
        Gv = Gvn = G;
    }
    if (top == dlevel) {
        Dv = cuddT(Dr);
        Dvn = cuddE(Dr);
        if (D != Dr) {
            Dv = Cudd_Not(Dv);
            Dvn = Cudd_Not(Dvn);
        }
    } else {
        Dv = Dvn = D;
    }

    /* Solve recursively. */
    res = Cudd_EquivDC(dd,Fv,Gv,Dv);
    if (res != 0) {
        res = Cudd_EquivDC(dd,Fvn,Gvn,Dvn);
    }
    cuddCacheInsert(dd,DD_EQUIV_DC_TAG,F,G,D,(res) ? One : Cudd_Not(One));

    return(res);

}